

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansv.hpp
# Opt level: O1

void ansv<unsigned_long,2,2,1>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *left_nsv,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *right_nsv,
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *lr_mins,comm *comm,size_t nonsv)

{
  pair<unsigned_long,_unsigned_long> *ppVar1;
  int iVar2;
  void *pvVar3;
  pointer puVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  unsigned_long *puVar7;
  _Map_pointer pppVar8;
  _Map_pointer pppVar9;
  comm *comm_00;
  long *plVar10;
  comm *pcVar11;
  _Elt_pointer ppVar12;
  ulong uVar13;
  _Elt_pointer ppVar14;
  pair<unsigned_long,_unsigned_long> *ppVar15;
  _Elt_pointer ppVar16;
  _Elt_pointer ppVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  pointer puVar21;
  int iVar22;
  _Elt_pointer ppVar23;
  pointer *ppuVar24;
  _Elt_pointer ppVar25;
  _Elt_pointer ppVar26;
  _Elt_pointer ppVar27;
  _Elt_pointer ppVar28;
  long lVar29;
  ulong *puVar30;
  pointer puVar31;
  pointer puVar32;
  long lVar33;
  pointer puVar34;
  ulong uVar35;
  _Elt_pointer ppVar36;
  _Elt_pointer ppVar37;
  _Elt_pointer ppVar38;
  unsigned_long uVar39;
  bool bVar40;
  size_t local_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> allmins;
  unsigned_long local_min;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  recved;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_1e8;
  _Elt_pointer local_198;
  _Elt_pointer local_190;
  comm *local_188;
  _Elt_pointer local_180;
  _Elt_pointer local_178;
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  *local_170;
  _Elt_pointer local_168;
  size_type local_160;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_158;
  _Elt_pointer local_140;
  _Elt_pointer local_138;
  pair<unsigned_long,_unsigned_long> local_130;
  _Elt_pointer local_120;
  pointer local_118;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_110;
  pointer local_f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  _Elt_pointer local_90;
  unsigned_long local_88;
  unsigned_long local_80;
  _Elt_pointer local_78;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_70;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_50;
  
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_170 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
               *)lr_mins;
  local_f8 = (pointer)nonsv;
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::_M_initialize_map(&local_1e8,0);
  local_160 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3;
  local_188 = comm;
  local_198 = (_Elt_pointer)mxx::exscan<unsigned_long,std::plus<unsigned_long>>(&local_160,comm);
  lVar19 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  if (lVar19 != 0) {
    lVar19 = lVar19 >> 3;
    lVar33 = (long)local_198 - 1;
LAB_0014310b:
    do {
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar38 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar38 = (_Elt_pointer)
                    (((_Elt_pointer)
                     ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second + 0x200);
        }
        if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar19 + -1] < ppVar38[-1].first) {
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 (_Elt_pointer)
                 ((_Elt_pointer)
                 ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second
            ;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 (_Map_pointer)
                 &((_Elt_pointer)
                  ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                  second;
          }
          else {
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          goto LAB_0014310b;
        }
      }
      while (lVar29 = (long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first >> 4,
            1 < ((long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_last -
                 (long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) + lVar29 +
                ((((ulong)((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node -
                          (long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1
                 ) + (ulong)((_Elt_pointer)
                             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                            (_Elt_pointer)0x0)) * 0x20) {
        ppVar38 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar38 = (_Elt_pointer)
                    (((_Elt_pointer)
                     ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second + 0x200);
        }
        uVar39 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar19 + -1];
        if (uVar39 != ppVar38[-1].first) break;
        uVar20 = lVar29 - 1;
        if (uVar20 < 0x20) {
          ppVar38 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          ppVar12 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
          ppVar17 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
        }
        else {
          uVar13 = uVar20 >> 5 | 0xf800000000000000;
          if (1 < lVar29) {
            uVar13 = uVar20 >> 5;
          }
          ppVar12 = (_Elt_pointer)
                    ((unsigned_long *)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node +
                    uVar13);
          ppVar17 = (_Elt_pointer)ppVar12->first;
          ppVar38 = ppVar17 + uVar20 + uVar13 * -0x20;
        }
        if (ppVar38 == ppVar17) {
          ppVar38 = (_Elt_pointer)(ppVar12[-1].second + 0x200);
        }
        if (uVar39 != ppVar38[-1].first) break;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
               (_Elt_pointer)
               ((_Elt_pointer)
               ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
               (_Map_pointer)
               &((_Elt_pointer)
                ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
        }
        else {
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(lVar19 + lVar33);
      local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar19 + -1];
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1e8,(pair<unsigned_long,_unsigned_long> *)&local_158);
      }
      else {
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      lVar19 = lVar19 + -1;
    } while (lVar19 != 0);
  }
  local_50.current._M_cur = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_50.current._M_first = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_50.current._M_last = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_50.current._M_node = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_70.current._M_cur = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_70.current._M_first = local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  local_70.current._M_last = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_70.current._M_node = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  vector<std::reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>,void>
            ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&local_158,&local_50,&local_70,(allocator_type *)&local_a8);
  pvVar3 = *(void **)local_170;
  *(pointer *)local_170 =
       local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(local_170 + 8) =
       local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)(local_170 + 0x10) =
       local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3);
  }
  local_180 = (_Elt_pointer)in;
  if (local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar8 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar14 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_178 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_190 = (_Elt_pointer)
              (((long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
              ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur -
               (long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
              ((((ulong)((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node -
                        (long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1)
              + (ulong)((_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                       (_Elt_pointer)0x0)) * 0x20);
  local_168 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppVar38 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar12 = local_198;
  ppVar17 = local_180;
  if (local_190 == (_Elt_pointer)0x0) {
    __assert_fail("n_left_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x60,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 2, indexing_type = 1]"
                 );
  }
  for (; local_198 = ppVar12, local_180 = ppVar17, ppVar38 < pppVar9;
      ppVar38 = (_Elt_pointer)&ppVar38->second) {
    operator_delete((pointer)ppVar38->second);
    ppVar12 = local_198;
    ppVar17 = local_180;
  }
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar8;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = local_168;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = local_178;
  if ((pointer)ppVar17->second !=
      (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ppVar17->first)->_M_impl).
      super__Vector_impl_data._M_start) {
    uVar20 = 0;
LAB_0014344e:
    do {
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar38 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar38 = (_Elt_pointer)
                    (((_Elt_pointer)
                     ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second + 0x200);
        }
        if ((((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ppVar17->first)->
            _M_impl).super__Vector_impl_data._M_start[uVar20] < ppVar38[-1].first) {
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 (_Elt_pointer)
                 ((_Elt_pointer)
                 ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second
            ;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 (_Map_pointer)
                 &((_Elt_pointer)
                  ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                  second;
          }
          else {
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          goto LAB_0014344e;
        }
      }
      while (lVar19 = (long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first >> 4,
            1 < ((long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_last -
                 (long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) + lVar19 +
                ((((ulong)((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node -
                          (long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1
                 ) + (ulong)((_Elt_pointer)
                             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                            (_Elt_pointer)0x0)) * 0x20) {
        ppVar38 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar38 = (_Elt_pointer)
                    (((_Elt_pointer)
                     ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second + 0x200);
        }
        uVar39 = (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ppVar17->first)->
                 _M_impl).super__Vector_impl_data._M_start[uVar20];
        if (uVar39 != ppVar38[-1].first) break;
        uVar13 = lVar19 - 1;
        if (uVar13 < 0x20) {
          ppVar38 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          ppVar14 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
          ppVar16 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
        }
        else {
          uVar35 = uVar13 >> 5 | 0xf800000000000000;
          if (1 < lVar19) {
            uVar35 = uVar13 >> 5;
          }
          ppVar14 = (_Elt_pointer)
                    ((pointer *)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + uVar35)
          ;
          ppVar16 = (_Elt_pointer)ppVar14->first;
          ppVar38 = ppVar16 + uVar13 + uVar35 * -0x20;
        }
        if (ppVar38 == ppVar16) {
          ppVar38 = (_Elt_pointer)(ppVar14[-1].second + 0x200);
        }
        if (uVar39 != ppVar38[-1].first) break;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
               (_Elt_pointer)
               ((_Elt_pointer)
               ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
               (_Map_pointer)
               &((_Elt_pointer)
                ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
        }
        else {
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(uVar20 + (long)ppVar12);
      local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ppVar17->first
                     )->_M_impl).super__Vector_impl_data._M_start[uVar20];
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1e8,(pair<unsigned_long,_unsigned_long> *)&local_158);
      }
      else {
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 < (ulong)((long)ppVar17->second -
                              (long)(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *
                                      )&ppVar17->first)->_M_impl).super__Vector_impl_data._M_start
                             >> 3));
  }
  ppVar17 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
  ppVar12 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppVar38 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  uVar20 = (long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node -
           (long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  bVar40 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node ==
           (_Elt_pointer)0x0;
  local_198 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_1e8._M_impl.super__Deque_impl_data._M_start._M_first)->first;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_1e8._M_impl.super__Deque_impl_data._M_start._M_last)->first;
  local_140 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first)->first;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last)->first;
  local_90 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  _M_range_insert<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>
            (local_170,*(undefined8 *)(local_170 + 8));
  pppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar8 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  lVar19 = (long)ppVar38 - (long)local_198;
  local_198 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_118 = (pointer)(local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  lVar19 = (lVar19 >> 4) + ((long)ppVar12 - (long)ppVar17 >> 4) +
           (((uVar20 >> 3) - 1) + (ulong)bVar40) * 0x20;
  ppVar12 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppVar17 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  ppVar38 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  pcVar11 = local_188;
  if (lVar19 == 0) {
    __assert_fail("n_right_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x76,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 2, indexing_type = 1]"
                 );
  }
  for (; local_168 = ppVar17, local_178 = ppVar12, local_188 = pcVar11, ppVar38 < pppVar9;
      ppVar38 = (_Elt_pointer)&ppVar38->second) {
    operator_delete((pointer)ppVar38->second);
    ppVar12 = local_178;
    ppVar17 = local_168;
    pcVar11 = local_188;
  }
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar8;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_198;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = local_178;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = local_168;
  if (lVar19 + (long)local_190 != *(long *)(local_170 + 8) - *(long *)local_170 >> 4) {
    __assert_fail("n_right_mins + n_left_mins == lr_mins.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x78,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 2, indexing_type = 1]"
                 );
  }
  mxx::allgather<unsigned_long>(&local_158,(unsigned_long *)&local_118,1,pcVar11);
  local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_a8,(long)pcVar11->m_size,(value_type_conflict *)&local_c0,
             (allocator_type *)&local_f0);
  local_f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_c0,(long)pcVar11->m_size,(value_type_conflict *)&local_f0,
             (allocator_type *)&local_d8);
  comm_00 = local_188;
  iVar2 = pcVar11->m_rank;
  lVar19 = (long)iVar2;
  if (0 < lVar19) {
    puVar21 = *(pointer *)
               ((long)local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar19 * 8 + -8);
    local_198 = *(_Elt_pointer *)local_170;
    puVar32 = (pointer)0x0;
    lVar33 = lVar19;
    do {
      puVar34 = puVar32;
      if ((puVar32 != (pointer)0x0 && lVar33 < lVar19) &&
         (puVar34 = (pointer)((long)puVar32 - 1U),
         puVar21 < (pointer)local_198[(long)((long)puVar32 - 1U)].first)) {
        puVar34 = puVar32;
      }
      lVar29 = lVar33 + -1;
      ppVar38 = (_Elt_pointer)((long)puVar32 + 1U);
      if ((pointer)((long)puVar32 + 1U) < local_190) {
        ppVar38 = local_190;
      }
      puVar30 = (ulong *)((long)puVar32 * 0x10 + *(long *)local_170);
      puVar31 = (pointer)((long)puVar32 - 1);
      do {
        puVar32 = (pointer)((long)ppVar38 - 1);
        if ((1 - (long)ppVar38) + (long)puVar31 == -1) break;
        puVar4 = (pointer)*puVar30;
        puVar32 = (pointer)((long)puVar31 + 1);
        puVar30 = puVar30 + 2;
        puVar31 = puVar32;
      } while (*(pointer *)
                ((long)local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar29 * 8) <= puVar4);
      puVar31 = *(pointer *)
                 ((long)local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar29 * 8);
      iVar22 = 0x12;
      if (puVar31 <= puVar21) {
        *(pointer *)
         ((long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + lVar29 * 8) =
             (pointer)((long)puVar32 + (1 - (long)puVar34));
        *(pointer *)
         ((long)local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + lVar29 * 8) = puVar34;
        iVar22 = (uint)(*(pointer *)
                         ((long)local_158.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar29 * 8) < local_118)
                 << 4;
        puVar21 = puVar31;
      }
    } while (((iVar22 == 0x12) || (iVar22 == 0)) && (bVar40 = 1 < lVar33, lVar33 = lVar29, bVar40));
  }
  iVar22 = local_188->m_size;
  if ((iVar2 < iVar22 + -1) && (iVar2 + 1 < iVar22)) {
    lVar33 = *(long *)local_170;
    uVar20 = *(long *)(local_170 + 8) - lVar33 >> 4;
    puVar21 = ((pointer *)
              ((long)local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start + 8))[lVar19];
    local_198 = (_Elt_pointer)
                local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_178 = (_Elt_pointer)
                local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    lVar19 = lVar19 + 1;
    puVar32 = (pointer)(uVar20 - 1);
    iVar18 = iVar2;
    do {
      puVar34 = puVar32;
      if (iVar2 < iVar18) {
        uVar13 = (long)puVar32 + 1U;
        if ((long)puVar32 + 1U < uVar20) {
          uVar13 = uVar20;
        }
        puVar31 = (pointer)((long)puVar32 + -1);
        puVar30 = (ulong *)((long)puVar32 * 0x10 + lVar33 + 0x10);
        do {
          puVar34 = (pointer)(uVar13 - 1);
          if (uVar20 <= (long)puVar31 + 2U) break;
          puVar34 = (pointer)((long)puVar31 + 1);
          puVar4 = (pointer)*puVar30;
          puVar31 = puVar34;
          puVar30 = puVar30 + 2;
        } while (puVar4 <= puVar21);
      }
      ppVar38 = (_Elt_pointer)puVar32;
      if (local_190 < puVar32) {
        puVar30 = (ulong *)((long)puVar32 * 0x10 + lVar33);
        do {
          ppVar38 = (_Elt_pointer)puVar32;
          if ((pointer)*puVar30 <
              ((pointer *)
              local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start)[lVar19]) break;
          puVar32 = (pointer)((long)puVar32 - 1);
          puVar30 = puVar30 + -2;
          ppVar38 = local_190;
        } while (local_190 < puVar32);
      }
      puVar32 = ((pointer *)
                local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start)[lVar19];
      iVar18 = 0x17;
      if (puVar32 <= puVar21) {
        ((pointer *)
        local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start)[lVar19] = (pointer)((long)puVar34 + (1 - (long)ppVar38));
        ((pointer *)
        local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start)[lVar19] = &ppVar38->first;
        iVar18 = 0;
        puVar21 = puVar32;
        if (((pointer *)
            local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start)[lVar19] < local_118) {
          iVar18 = 0x15;
        }
      }
      if ((iVar18 != 0x17) && (iVar18 != 0)) break;
      iVar18 = (int)lVar19;
      lVar19 = lVar19 + 1;
      puVar32 = &ppVar38->first;
    } while (iVar22 != (int)lVar19);
  }
  mxx::all2all<unsigned_long>(&local_f0,&local_a8,local_188);
  mxx::impl::get_displacements<unsigned_long>(&local_d8,&local_f0);
  uVar39 = local_f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  uVar5 = local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish[-1];
  ppVar38 = (_Elt_pointer)(uVar39 + uVar5);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(&local_110,(size_type)ppVar38,(allocator_type *)&local_130);
  mxx::all2allv<std::pair<unsigned_long,unsigned_long>>
            (*(pair<unsigned_long,_unsigned_long> **)local_170,&local_a8,&local_c0,
             local_110.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_f0,&local_d8,comm_00);
  local_198 = (_Elt_pointer)
              local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[comm_00->m_rank];
  local_138 = ppVar38;
  local_88 = uVar5;
  local_80 = uVar39;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(left_nsv,local_160);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(right_nsv,local_160);
  pppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar8 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar17 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_190 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_188 = (comm *)local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppVar12 = local_180;
  for (ppVar38 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
      local_180 = ppVar12, ppVar38 < pppVar9; ppVar38 = (_Elt_pointer)&ppVar38->second) {
    operator_delete((pointer)ppVar38->second);
    ppVar12 = local_180;
  }
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar17;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar8;
  lVar19 = (long)ppVar12->second -
           (long)(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ppVar12->first)->
                 _M_impl).super__Vector_impl_data._M_start;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_190;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)local_188;
  if (lVar19 != 0) {
    puVar21 = (pointer)(lVar19 >> 3);
    do {
      puVar21 = (pointer)((long)puVar21 - 1);
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        local_190 = (_Elt_pointer)
                    (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ppVar12->first
                     )->_M_impl).super__Vector_impl_data._M_start;
        do {
          ppVar38 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar38 = (_Elt_pointer)
                      (((_Elt_pointer)
                       ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                       second + 0x200);
          }
          if ((pointer)ppVar38[-1].first <= *(pointer *)((long)local_190 + (long)puVar21 * 8))
          break;
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            uVar39 = ((_Elt_pointer)
                     ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second;
            (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[*(long *)(uVar39 + 0x1f8)] = (unsigned_long)puVar21;
            ppVar38 = (_Elt_pointer)(uVar39 + 0x200);
          }
          else {
            (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second] =
                 (unsigned_long)puVar21;
            ppVar38 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          }
          uVar39 = ppVar38[-1].first;
          uVar5 = ppVar38[-1].second;
          while( true ) {
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                   (_Elt_pointer)
                   ((_Elt_pointer)
                   ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                   second;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   (_Map_pointer)
                   &((_Elt_pointer)
                    ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second;
            }
            else {
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
            ppVar38 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVar38 = (_Elt_pointer)
                        (((_Elt_pointer)
                         ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                         ->second + 0x200);
            }
            if (uVar39 != ppVar38[-1].first) break;
            ppVar38 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVar38 = (_Elt_pointer)
                        (((_Elt_pointer)
                         ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                         ->second + 0x200);
            }
            (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[ppVar38[-1].second] = uVar5;
          }
          ppVar12 = local_180;
        } while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
      }
      local_130.first =
           (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ppVar12->first)->
           _M_impl).super__Vector_impl_data._M_start[(long)puVar21];
      local_130.second = (unsigned_long)puVar21;
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1e8,&local_130);
      }
      else {
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_130.first;
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = (unsigned_long)puVar21
        ;
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
    } while (puVar21 != (pointer)0x0);
  }
  if (local_198 != (_Elt_pointer)0x0) {
    local_78 = (_Elt_pointer)((long)&local_198[-1].second + 7);
    local_120 = (_Elt_pointer)((long)local_198 * 0x10 + -0x10);
    ppVar38 = (_Elt_pointer)0x0;
    do {
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      local_178 = (_Elt_pointer)((long)&local_198->first + ~(ulong)ppVar38);
      local_168 = (_Elt_pointer)((long)local_178 * 0x10);
      ppVar15 = local_110.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start + (long)local_178;
      local_190 = (_Elt_pointer)((long)local_178 + local_160);
      local_188 = (comm *)ppVar38;
      do {
        ppVar38 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar38 = (_Elt_pointer)
                    (((_Elt_pointer)
                     ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second + 0x200);
        }
        if (ppVar38[-1].first <= ppVar15->first) break;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          uVar39 = ((_Elt_pointer)
                   ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                   second;
          (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[*(long *)(uVar39 + 0x1f8)] = (unsigned_long)local_190;
          ppVar38 = (_Elt_pointer)(uVar39 + 0x200);
        }
        else {
          (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start
          [local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second] =
               (unsigned_long)local_190;
          ppVar38 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        }
        uVar39 = ppVar38[-1].first;
        uVar5 = ppVar38[-1].second;
        while( true ) {
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 (_Elt_pointer)
                 ((_Elt_pointer)
                 ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second
            ;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 (_Map_pointer)
                 &((_Elt_pointer)
                  ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                  second;
          }
          else {
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
          ppVar38 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar38 = (_Elt_pointer)
                      (((_Elt_pointer)
                       ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                       second + 0x200);
          }
          if (uVar39 != ppVar38[-1].first) break;
          ppVar38 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar38 = (_Elt_pointer)
                      (((_Elt_pointer)
                       ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                       second + 0x200);
          }
          (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[ppVar38[-1].second] = uVar5;
        }
      } while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
      pcVar11 = local_188;
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar38 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar38 = (_Elt_pointer)
                    (((_Elt_pointer)
                     ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second + 0x200);
        }
        if (*(unsigned_long *)
             ((long)&local_168->first +
             (long)&(local_110.
                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->first) == ppVar38[-1].first) {
          ppVar38 = local_178;
          if (local_178 != (_Elt_pointer)0x0) {
            plVar10 = (long *)((long)&local_120[-(long)local_188].first +
                              (long)&(local_110.
                                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->first);
            do {
              if (*plVar10 != plVar10[-2]) goto LAB_00143f18;
              pcVar11 = (comm *)((long)&((_Elt_pointer)pcVar11)->first + 1);
              plVar10 = plVar10 + -2;
              ppVar38 = (_Elt_pointer)((long)ppVar38 + -1);
            } while (ppVar38 != (_Elt_pointer)0x0);
            ppVar38 = (_Elt_pointer)0x0;
            pcVar11 = (comm *)local_78;
          }
LAB_00143f18:
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
              local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
            ppVar12 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVar12 = (_Elt_pointer)
                        (((_Elt_pointer)
                         ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                         ->second + 0x200);
            }
            if (ppVar12[-1].first !=
                local_110.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start[(long)ppVar38].first) goto LAB_00143fcc;
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start
              [*(long *)(((_Elt_pointer)
                         ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                         ->second + 0x1f8)] = (long)ppVar38 + local_160;
              operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                   (_Elt_pointer)
                   ((_Elt_pointer)
                   ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                   second;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   (_Map_pointer)
                   &((_Elt_pointer)
                    ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second;
            }
            else {
              (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start
              [local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second] =
                   (long)ppVar38 + local_160;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
            goto LAB_00143f18;
          }
        }
      }
LAB_00143fcc:
      ppVar38 = (_Elt_pointer)((long)&((_Elt_pointer)pcVar11)->first + 1);
    } while (ppVar38 < local_198);
  }
  pppVar8 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar17 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  ppVar12 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppVar38 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_178 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_188 = (comm *)(left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        )._M_impl.super__Vector_impl_data._M_start;
    ppVar14 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar16 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVar27 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
    do {
      puVar21 = (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start;
      local_190 = ppVar14;
      ppVar28 = ppVar16;
      ppVar36 = ppVar27;
      while( true ) {
        lVar19 = (long)ppVar28 - (long)ppVar36 >> 4;
        uVar20 = lVar19 - 1;
        if (uVar20 < 0x20) {
          ppVar25 = ppVar28 + -1;
        }
        else {
          uVar13 = uVar20 >> 5 | 0xf800000000000000;
          if (1 < lVar19) {
            uVar13 = uVar20 >> 5;
          }
          ppVar25 = (_Elt_pointer)
                    ((pointer)(&local_190->first)[uVar13] + (uVar20 + uVar13 * -0x20) * 2);
        }
        if (ppVar25 == local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
        ppVar25 = ppVar16;
        if (ppVar16 == ppVar27) {
          ppVar25 = (_Elt_pointer)(ppVar14[-1].second + 0x200);
        }
        if (uVar20 < 0x20) {
          ppVar37 = ppVar28 + -1;
          ppVar23 = local_190;
          ppVar26 = ppVar36;
        }
        else {
          uVar13 = uVar20 >> 5 | 0xf800000000000000;
          if (1 < lVar19) {
            uVar13 = uVar20 >> 5;
          }
          ppVar23 = (_Elt_pointer)(&local_190->first + uVar13);
          ppVar26 = (_Elt_pointer)ppVar23->first;
          ppVar37 = ppVar26 + uVar20 + uVar13 * -0x20;
        }
        if (ppVar37 == ppVar26) {
          ppVar37 = (_Elt_pointer)(ppVar23[-1].second + 0x200);
        }
        if (ppVar25[-1].first != ppVar37[-1].first) break;
        if (ppVar28 == ppVar36) {
          ppVar36 = (_Elt_pointer)local_190[-1].second;
          local_190 = (_Elt_pointer)&local_190[-1].second;
          ppVar28 = ppVar36 + 0x20;
        }
        ppVar25 = ppVar16;
        if (ppVar16 == ppVar27) {
          ppVar25 = (_Elt_pointer)(ppVar14[-1].second + 0x200);
        }
        ppVar28 = ppVar28 + -1;
        ppVar37 = ppVar28;
        if (ppVar28 == ppVar36) {
          ppVar37 = (_Elt_pointer)(local_190[-1].second + 0x200);
        }
        puVar21[ppVar37[-1].second] = ppVar25[-1].second;
      }
      if (ppVar16 == ppVar27) {
        ppVar16 = (_Elt_pointer)(ppVar14[-1].second + 0x200);
      }
      (&((_Elt_pointer)local_188)->first)[ppVar16[-1].second] = (unsigned_long)local_f8;
      if (ppVar28 == ppVar36) {
        ppVar36 = (_Elt_pointer)local_190[-1].second;
        local_190 = (_Elt_pointer)&local_190[-1].second;
        ppVar28 = ppVar36 + 0x20;
      }
      ppVar16 = ppVar28 + -1;
      ppVar14 = local_190;
      ppVar27 = ppVar36;
    } while (ppVar16 != local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  ppVar14 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  if (local_1e8._M_impl.super__Deque_impl_data._M_start._M_node <
      local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node) {
    do {
      ppuVar24 = (pointer *)&ppVar14->second;
      operator_delete((pointer)ppVar14->second);
      ppVar14 = (_Elt_pointer)ppuVar24;
    } while (ppuVar24 < local_178);
  }
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar38;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar12;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar17;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar8;
  puVar21 = (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_180->first)->
            _M_impl).super__Vector_impl_data._M_start;
  if ((pointer)local_180->second != puVar21) {
    puVar32 = (pointer)0x0;
    ppVar38 = local_180;
    do {
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        do {
          ppVar12 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar12 = (_Elt_pointer)
                      (((_Elt_pointer)
                       ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                       second + 0x200);
          }
          if (ppVar12[-1].first <= puVar21[(long)puVar32]) break;
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            uVar39 = ((_Elt_pointer)
                     ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second;
            (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[*(long *)(uVar39 + 0x1f8)] = (unsigned_long)puVar32;
            ppVar38 = (_Elt_pointer)(uVar39 + 0x200);
          }
          else {
            (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second] =
                 (unsigned_long)puVar32;
            ppVar38 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          }
          uVar39 = ppVar38[-1].first;
          uVar5 = ppVar38[-1].second;
          while( true ) {
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                   (_Elt_pointer)
                   ((_Elt_pointer)
                   ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                   second;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   (_Map_pointer)
                   &((_Elt_pointer)
                    ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second;
            }
            else {
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
            ppVar38 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVar38 = (_Elt_pointer)
                        (((_Elt_pointer)
                         ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                         ->second + 0x200);
            }
            if (uVar39 != ppVar38[-1].first) break;
            ppVar38 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVar38 = (_Elt_pointer)
                        (((_Elt_pointer)
                         ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                         ->second + 0x200);
            }
            (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[ppVar38[-1].second] = uVar5;
          }
          ppVar38 = local_180;
        } while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
      }
      local_130.first =
           (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ppVar38->first)->
           _M_impl).super__Vector_impl_data._M_start[(long)puVar32];
      local_130.second = (unsigned_long)puVar32;
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1e8,&local_130);
      }
      else {
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_130.first;
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = (unsigned_long)puVar32
        ;
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      puVar32 = (pointer)((long)puVar32 + 1);
      puVar21 = (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ppVar38->first)->
                _M_impl).super__Vector_impl_data._M_start;
    } while (puVar32 < (pointer)((long)ppVar38->second - (long)puVar21 >> 3));
  }
  if (local_138 != local_198) {
    ppVar38 = (_Elt_pointer)((long)local_138 - (long)local_198);
    local_120 = (_Elt_pointer)(local_80 + local_88 + -1);
    ppVar12 = (_Elt_pointer)0x0;
    local_138 = ppVar38;
    do {
      pcVar11 = (comm *)local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppVar17 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        local_188 = (comm *)local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_178 = (_Elt_pointer)((long)&ppVar12->first + (long)&local_198->first);
        local_168 = (_Elt_pointer)((long)local_178 * 0x10);
        ppVar15 = local_110.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (long)local_178;
        uVar39 = (long)&local_178->first + local_160;
        local_180 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        local_190 = ppVar12;
        do {
          ppVar38 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar38 = (_Elt_pointer)
                      (((_Elt_pointer)
                       ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                       second + 0x200);
          }
          if (ppVar38[-1].first <= ppVar15->first) break;
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            uVar5 = ((_Elt_pointer)
                    ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second;
            (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[*(long *)(uVar5 + 0x1f8)] = uVar39;
            ppVar38 = (_Elt_pointer)(uVar5 + 0x200);
          }
          else {
            (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second] = uVar39;
            ppVar38 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          }
          uVar5 = ppVar38[-1].first;
          uVar6 = ppVar38[-1].second;
          while( true ) {
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                   (_Elt_pointer)
                   ((_Elt_pointer)
                   ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                   second;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   (_Map_pointer)
                   &((_Elt_pointer)
                    ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second;
            }
            else {
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
            ppVar38 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVar38 = (_Elt_pointer)
                        (((_Elt_pointer)
                         ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                         ->second + 0x200);
            }
            if (uVar5 != ppVar38[-1].first) break;
            ppVar38 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVar38 = (_Elt_pointer)
                        (((_Elt_pointer)
                         ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                         ->second + 0x200);
            }
            (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[ppVar38[-1].second] = uVar6;
          }
        } while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
        ppVar38 = local_138;
        pcVar11 = local_188;
        ppVar17 = local_180;
        ppVar12 = local_190;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
            local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
          ppVar14 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar14 = (_Elt_pointer)
                      (((_Elt_pointer)
                       ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                       second + 0x200);
          }
          if (*(unsigned_long *)
               ((long)&local_168->first +
               (long)&(local_110.
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->first) == ppVar14[-1].first) {
            ppVar14 = local_178;
            if (((_Elt_pointer)((long)&local_190->first + 1U) < local_138) &&
               (*(long *)((long)&local_168->first +
                         (long)&(local_110.
                                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->first) ==
                *(long *)((long)&local_168->first +
                         (long)&local_110.
                                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[1].first))) {
              ppVar15 = local_110.
                        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start +
                        (long)&local_190->first + (long)&local_198->first + 2;
              do {
                ppVar16 = ppVar12;
                ppVar14 = local_120;
                if (local_138 <= (_Elt_pointer)((long)&ppVar16->first + 2U)) goto LAB_0014480d;
                ppVar1 = ppVar15 + -1;
                ppVar12 = (_Elt_pointer)((long)&ppVar16->first + 1);
                puVar7 = &ppVar15->first;
                ppVar15 = ppVar15 + 1;
              } while (ppVar1->first == *puVar7);
              ppVar14 = (_Elt_pointer)((long)&local_198->first + (long)&ppVar12->first);
LAB_0014480d:
              ppVar12 = (_Elt_pointer)((long)&ppVar16->first + 1);
            }
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
              do {
                ppVar16 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
                if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  ppVar16 = (_Elt_pointer)
                            (((_Elt_pointer)
                             ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node +
                             -0x10))->second + 0x200);
                }
                pcVar11 = local_188;
                ppVar17 = local_180;
                if (ppVar16[-1].first !=
                    local_110.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[(long)ppVar14].first) break;
                uVar39 = (long)&ppVar14->first + local_160;
                if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start
                  [*(long *)(((_Elt_pointer)
                             ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node +
                             -0x10))->second + 0x1f8)] = uVar39;
                  operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
                  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                       (_Elt_pointer)
                       ((_Elt_pointer)
                       ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                       second;
                  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                       local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
                  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
                  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                       (_Map_pointer)
                       &((_Elt_pointer)
                        ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                        ->second;
                }
                else {
                  (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start
                  [local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second] = uVar39;
                  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
                }
                pcVar11 = local_188;
                ppVar17 = local_180;
              } while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                       local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
            }
          }
        }
      }
    } while (((comm *)ppVar17 != pcVar11) &&
            (ppVar12 = (_Elt_pointer)((long)&ppVar12->first + 1), ppVar12 < ppVar38));
  }
  if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_180 = (_Elt_pointer)
                (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start;
    ppVar38 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar12 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
    ppVar17 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    do {
      puVar21 = (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start;
      ppVar27 = ppVar38;
      ppVar16 = ppVar12;
      ppVar14 = ppVar17;
      while( true ) {
        lVar19 = (long)ppVar14 - (long)ppVar16 >> 4;
        uVar20 = lVar19 - 1;
        if (uVar20 < 0x20) {
          ppVar28 = ppVar14 + -1;
        }
        else {
          uVar13 = uVar20 >> 5 | 0xf800000000000000;
          if (1 < lVar19) {
            uVar13 = uVar20 >> 5;
          }
          ppVar28 = (_Elt_pointer)
                    ((pointer)(&ppVar27->first)[uVar13] + (uVar20 + uVar13 * -0x20) * 2);
        }
        if (ppVar28 == local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
        ppVar28 = ppVar17;
        if (ppVar17 == ppVar12) {
          ppVar28 = (_Elt_pointer)(ppVar38[-1].second + 0x200);
        }
        if (uVar20 < 0x20) {
          ppVar36 = ppVar14 + -1;
          ppVar37 = ppVar16;
          ppVar25 = ppVar27;
        }
        else {
          uVar13 = uVar20 >> 5 | 0xf800000000000000;
          if (1 < lVar19) {
            uVar13 = uVar20 >> 5;
          }
          ppVar25 = (_Elt_pointer)(&ppVar27->first + uVar13);
          ppVar37 = (_Elt_pointer)ppVar25->first;
          ppVar36 = ppVar37 + uVar20 + uVar13 * -0x20;
        }
        if (ppVar36 == ppVar37) {
          ppVar36 = (_Elt_pointer)(ppVar25[-1].second + 0x200);
        }
        if (ppVar28[-1].first != ppVar36[-1].first) break;
        if (ppVar14 == ppVar16) {
          ppVar16 = (_Elt_pointer)ppVar27[-1].second;
          ppVar27 = (_Elt_pointer)&ppVar27[-1].second;
          ppVar14 = ppVar16 + 0x20;
        }
        ppVar28 = ppVar17;
        if (ppVar17 == ppVar12) {
          ppVar28 = (_Elt_pointer)(ppVar38[-1].second + 0x200);
        }
        ppVar14 = ppVar14 + -1;
        ppVar36 = ppVar14;
        if (ppVar14 == ppVar16) {
          ppVar36 = (_Elt_pointer)(ppVar27[-1].second + 0x200);
        }
        puVar21[ppVar36[-1].second] = ppVar28[-1].second;
      }
      if (ppVar17 == ppVar12) {
        ppVar17 = (_Elt_pointer)(ppVar38[-1].second + 0x200);
      }
      (&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_180->first)->_M_impl
        ).super__Vector_impl_data._M_start)[ppVar17[-1].second] = local_f8;
      if (ppVar14 == ppVar16) {
        ppVar16 = (_Elt_pointer)ppVar27[-1].second;
        ppVar27 = (_Elt_pointer)&ppVar27[-1].second;
        ppVar14 = ppVar16 + 0x20;
      }
      ppVar17 = ppVar14 + -1;
      ppVar38 = ppVar27;
      ppVar12 = ppVar16;
    } while (ppVar17 != local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::operator=((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)local_170,&local_110);
  if (local_110.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
    operator_delete(local_110.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Deque_base(&local_1e8);
  return;
}

Assistant:

void ansv(const std::vector<T>& in, std::vector<size_t>& left_nsv, std::vector<size_t>& right_nsv, std::vector<std::pair<T,size_t> >& lr_mins, const mxx::comm& comm, size_t nonsv = 0) {
    std::deque<std::pair<T,size_t> > q;
    size_t local_size = in.size();
    size_t prefix = mxx::exscan(local_size, comm);

    /*****************************************************************
     *  Step 1: Locally calculate ANSV and save un-matched elements  *
     *****************************************************************/

    // backwards direction (left mins)
    for (size_t i = in.size(); i > 0; --i) {
        while (!q.empty() && in[i-1] < q.back().first)
            q.pop_back();
        if (right_type == furthest_eq) {
            // remove all equal elements but the last
            while (q.size() >= 2 && in[i-1] == q.back().first && in[i-1] == (q.rbegin()+1)->first) {
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i-1] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
    }
    // add results to left_mins
    lr_mins = std::vector<std::pair<T,size_t>>(q.rbegin(), q.rend());
    size_t n_left_mins = q.size();
    assert(n_left_mins >= 1);
    q.clear();

    // forward direction (right mins)
    for (size_t i = 0; i < in.size(); ++i) {
        while (!q.empty() && in[i] < q.back().first)
            q.pop_back();
        if (left_type == furthest_eq) {
            while (q.size() >= 2 && in[i] == q.back().first && in[i] == (q.rbegin()+1)->first) {
                // remove all but the last one that is equal, TODO: can be `if` instead
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i], prefix+i));
    }
    // add results to right_mins
    size_t n_right_mins = q.size();
    lr_mins.insert(lr_mins.end(), q.begin(), q.end());
    T local_min = q.front().first;
    assert(n_right_mins >= 1);
    q.clear();
    assert(n_right_mins + n_left_mins == lr_mins.size());

    /***************************************************************
     *  Step 2: communicate un-matched elements to correct target  *
     ***************************************************************/

    // allgather min and max of all left and right mins
    //assert(local_min == lr_mins.front().first);
    std::vector<T> allmins = mxx::allgather(local_min, comm);
    std::vector<size_t> send_counts(comm.size(), 0);
    std::vector<size_t> send_displs(comm.size(), 0);

    // calculate which processor to exchange unmatched left_mins and right_mins with
    // 1) calculate communication parameters for left processes
    if (comm.rank() > 0) {
        size_t left_idx = 0;
        T prev_mins_min = allmins[comm.rank()-1];
        for (int i = comm.rank()-1; i >= 0; --i) {
            size_t start_idx = left_idx;
            // move start back to other `equal` elements (there can be at most 2)
            if (right_type == furthest_eq && i < comm.rank()-1) {
                if (start_idx > 0 && lr_mins[start_idx-1].first <= prev_mins_min) {
                    --start_idx;
                }
            }
            while (left_idx+1 < n_left_mins && lr_mins[left_idx].first >= allmins[i]) {
                ++left_idx;
            }
            // don't send anything if min is dominated by previous
            if (allmins[i] > prev_mins_min) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // send all from [left_idx, start_idx] (inclusive) to proc `i`
            send_counts[i] = left_idx - start_idx + 1;
            send_displs[i] = start_idx;

            // set comm parameters
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // 2) calculate communication parameters for right process
    if (comm.rank() < comm.size()-1) {
        size_t right_idx = lr_mins.size()-1; // n_left_mins;
        T prev_mins_min = allmins[comm.rank()+1];
        for (int i = comm.rank()+1; i < comm.size(); ++i) {
            // find the range which should be send
            size_t end_idx = right_idx;
            if (left_type == furthest_eq && i > comm.rank()+1) {
                // move start back to other `equal` elements
                while (end_idx+1 < lr_mins.size() && lr_mins[end_idx+1].first <= prev_mins_min) {
                    ++end_idx;
                }
            }
            while (right_idx > n_left_mins && lr_mins[right_idx].first >= allmins[i]) {
                --right_idx;
            }

            // don't send if the minimum of `i` is dominated by a prev min right of me
            if (prev_mins_min < allmins[i]) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // now right_idx is the first one that is smaller than the min of `i`
            // send all elements from [start_idx, right_idx]
            send_counts[i] = end_idx - right_idx + 1;
            send_displs[i] = right_idx;

            // can stop if an overall smaller min than my own has been found
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // exchange lr_mins via all2all
    std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
    std::vector<size_t> recv_displs = mxx::impl::get_displacements(recv_counts);
    size_t recv_size = recv_counts.back() + recv_displs.back();
    std::vector<std::pair<T, size_t>> recved(recv_size);
    mxx::all2allv(&lr_mins[0], send_counts, send_displs, &recved[0], recv_counts, recv_displs, comm);

    // solve locally given the exchanged values (by prefilling min-queue before running locally)
    size_t n_left_recv = recv_displs[comm.rank()];
    size_t n_right_recv = recv_size - n_left_recv;


    /***************************************************************
     *  Step 3: Again solve ANSV locally and use lr_mins as tails  *
     ***************************************************************/

    left_nsv.resize(local_size);
    right_nsv.resize(local_size);

    q.clear();
    // iterate backwards to get the nearest smaller element to left for each element
    // TODO: this doesn't really require pairs in the queue (index suffices)
    for (size_t i = in.size(); i > 0; --i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], prefix+i-1, prefix);
            q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
        } else { // indexing_type == local_indexing
            // prefix=0 for local indexing
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], i-1, 0);
            q.push_back(std::pair<T, size_t>(in[i-1], i-1));
        }
    }

    // now go backwards through the right-mins from the previous processors,
    // in order to resolve all local elements
    for (size_t i = 0; i < n_left_recv; ++i) {
        if (q.empty()) {
            break;
        }
        size_t rcv_idx = n_left_recv - i - 1;

        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            // prefix = 0, recv.2nd = local_size+rcv_idx,
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, local_size + rcv_idx, 0);
        }

        if (left_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (rcv_idx != 0 && recved[rcv_idx].first == recved[rcv_idx-1].first) {
                    i++;
                    rcv_idx = n_left_recv - i - 1;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        left_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        left_nsv[q.back().second] = local_size + rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    //  -> set these to a special value and handle case if furthest_eq
    //     elements are still waiting in queue
    const size_t iprefix = (indexing_type == global_indexing) ? prefix : 0;
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (left_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    left_nsv[it2->second - iprefix] = it->second;
                }
                left_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            left_nsv[it->second - iprefix] = nonsv;
        }
    }

    // iterate forwards to get the nearest smaller value to the right for each element
    q.clear();
    for (size_t i = 0; i < in.size(); ++i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], prefix+i, prefix);
            q.push_back(std::pair<T, size_t>(in[i], prefix+i));
        } else { // indexing_type == local_indexing
            // handle as if prefix = 0
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], i, 0);
            q.push_back(std::pair<T, size_t>(in[i], i));
        }
    }

    // now go forwards through left-mins of succeeding processors
    for (size_t i = 0; i < n_right_recv; ++i) {
        size_t rcv_idx = n_left_recv + i;
        if (q.empty()) {
            break;
        }
        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, local_size+rcv_idx, 0);
        }

        if (right_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (i+1 < n_right_recv  && recved[rcv_idx].first == recved[rcv_idx+1].first) {
                    i++;
                    rcv_idx = n_left_recv + i;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        right_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        right_nsv[q.back().second] = local_size+rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    // -> set these to a special value and handle case if furthest_eq elements
    // are still waiting in queue
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (right_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    right_nsv[it2->second - iprefix] = it->second;
                }
                right_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            right_nsv[it->second - iprefix] = nonsv;
        }
    }

    lr_mins = recved;
}